

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lfunc.c
# Opt level: O3

void luaF_initupvals(lua_State *L,LClosure *cl)

{
  UpVal *v;
  ulong uVar1;
  
  if (cl->nupvalues != '\0') {
    uVar1 = 0;
    do {
      v = (UpVal *)luaC_newobj(L,'\t',0x28);
      (v->v).p = (TValue *)&v->u;
      *(undefined1 *)((long)&v->u + 8) = 0;
      cl->upvals[uVar1] = v;
      if (((cl->marked & 0x20) != 0) && ((v->marked & 0x18) != 0)) {
        luaC_barrier_(L,(GCObject *)cl,(GCObject *)v);
      }
      uVar1 = uVar1 + 1;
    } while (uVar1 < cl->nupvalues);
  }
  return;
}

Assistant:

void luaF_initupvals (lua_State *L, LClosure *cl) {
  int i;
  for (i = 0; i < cl->nupvalues; i++) {
    GCObject *o = luaC_newobj(L, LUA_VUPVAL, sizeof(UpVal));
    UpVal *uv = gco2upv(o);
    uv->v.p = &uv->u.value;  /* make it closed */
    setnilvalue(uv->v.p);
    cl->upvals[i] = uv;
    luaC_objbarrier(L, cl, uv);
  }
}